

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<long,_8> * __thiscall
TPZManVector<long,_8>::operator=(TPZManVector<long,_8> *this,TPZManVector<long,_8> *rval)

{
  long *plVar1;
  int64_t iVar2;
  TPZManVector<long,_8> *in_RSI;
  TPZManVector<long,_8> *in_RDI;
  int i;
  int64_t nel;
  int local_1c;
  
  if (in_RDI != in_RSI) {
    iVar2 = TPZVec<long>::NElements(&in_RSI->super_TPZVec<long>);
    if (((in_RDI->super_TPZVec<long>).fStore != (long *)0x0) &&
       ((in_RDI->super_TPZVec<long>).fStore != in_RDI->fExtAlloc)) {
      plVar1 = (in_RDI->super_TPZVec<long>).fStore;
      if (plVar1 != (long *)0x0) {
        operator_delete__(plVar1);
      }
      (in_RDI->super_TPZVec<long>).fStore = (long *)0x0;
      (in_RDI->super_TPZVec<long>).fNAlloc = 0;
    }
    if (iVar2 < 9) {
      for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
        in_RDI->fExtAlloc[local_1c] = in_RSI->fExtAlloc[local_1c];
      }
      for (; local_1c < 8; local_1c = local_1c + 1) {
        in_RDI->fExtAlloc[local_1c] = 0;
      }
      (in_RDI->super_TPZVec<long>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<long>).fNAlloc = 0;
      (in_RDI->super_TPZVec<long>).fNElements = iVar2;
    }
    else {
      (in_RDI->super_TPZVec<long>).fStore = (in_RSI->super_TPZVec<long>).fStore;
      (in_RDI->super_TPZVec<long>).fNAlloc = iVar2;
      (in_RDI->super_TPZVec<long>).fNElements = iVar2;
    }
  }
  (in_RSI->super_TPZVec<long>).fStore = (long *)0x0;
  (in_RSI->super_TPZVec<long>).fNAlloc = 0;
  (in_RSI->super_TPZVec<long>).fNElements = 0;
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}